

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::GiveDefaultInventory(APlayerPawn *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *pAVar4;
  int local_68;
  APlayerPawn *local_58;
  AActor *check;
  AInventory *item;
  PClassActor *local_40;
  PClassActor *ti;
  DDropItem *di;
  ABasicArmor *barmor;
  AHexenArmor *pAStack_20;
  int i;
  AHexenArmor *harmor;
  PClassPlayerPawn *myclass;
  APlayerPawn *this_local;
  
  if ((this->super_AActor).player != (player_t *)0x0) {
    myclass = (PClassPlayerPawn *)this;
    harmor = (AHexenArmor *)GetClass(this);
    AActor::GiveInventoryType
              (&this->super_AActor,(PClassActor *)AHexenArmor::RegistrationInfo.MyClass);
    pAStack_20 = AActor::FindInventory<AHexenArmor>(&this->super_AActor);
    pAStack_20->Slots[4] =
         *(double *)&(harmor->super_AArmor).super_AInventory.super_AActor.TIDtoHate;
    for (barmor._4_4_ = 0; barmor._4_4_ < 4; barmor._4_4_ = barmor._4_4_ + 1) {
      pAStack_20->SlotsIncrement[barmor._4_4_] =
           *(double *)
            ((harmor->super_AArmor).super_AInventory.super_AActor.args +
            (long)(barmor._4_4_ + 1) * 2 + -0xc);
    }
    di = (DDropItem *)Spawn<ABasicArmor>();
    AInventory::BecomeItem((AInventory *)di);
    di[0x14].super_DObject._vptr_DObject = (_func_int **)0x0;
    *(undefined4 *)&di[0x13].super_DObject.Class = 0;
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x14])(this,di);
    for (ti = (PClassActor *)AActor::GetDropItems(&this->super_AActor); ti != (PClassActor *)0x0;
        ti = *(PClassActor **)
              &(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
               super_PCompoundType.super_PType.Align) {
      FName::FName((FName *)((long)&item + 4),
                   (FName *)&(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                             super_PCompoundType.super_PType.HashNext);
      local_40 = PClass::FindActor((FName *)((long)&item + 4));
      if (local_40 != (PClassActor *)0x0) {
        bVar1 = PClass::IsDescendantOf(&local_40->super_PClass,AInventory::RegistrationInfo.MyClass)
        ;
        if (bVar1) {
          check = &AActor::FindInventory(&this->super_AActor,local_40,false)->super_AActor;
          if ((AInventory *)check == (AInventory *)0x0) {
            check = Spawn(local_40);
            *(uint *)&check[1].super_DThinker.NextThinker =
                 *(uint *)&check[1].super_DThinker.NextThinker | 0x4000;
            *(undefined4 *)&check[1].super_DThinker.super_DObject.Class =
                 *(undefined4 *)
                  &(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.Symbols.ParentSymbolTable;
            bVar1 = DObject::IsKindOf((DObject *)check,AWeapon::RegistrationInfo.MyClass);
            if (bVar1) {
              *(undefined4 *)((long)&check[1].__Pos.Y + 4) = 0;
              *(undefined4 *)&check[1].__Pos.Y = 0;
            }
            bVar1 = AInventory::CallTryPickup
                              ((AInventory *)check,&this->super_AActor,(AActor **)&local_58);
            if (!bVar1) {
              if (local_58 != this) {
                I_Error("Cannot give morph items when starting a game");
              }
              (*(check->super_DThinker).super_DObject._vptr_DObject[4])();
              check = (AActor *)0x0;
            }
          }
          else {
            iVar2 = ((AInventory *)check)->Amount;
            if (*(int *)&(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                         super_PCompoundType.super_PType.Symbols.ParentSymbolTable == 0) {
              pAVar4 = AActor::GetDefault(check);
              local_68 = *(int *)&pAVar4[1].super_DThinker.super_DObject.Class;
            }
            else {
              local_68 = *(int *)&(ti->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.super_PCompoundType.super_PType.Symbols.
                                  ParentSymbolTable;
            }
            iVar2 = clamp<int>(iVar2 + local_68,0,
                               *(int *)((long)&check[1].super_DThinker.super_DObject.Class + 4));
            *(int *)&check[1].super_DThinker.super_DObject.Class = iVar2;
          }
          if (((check != (AActor *)0x0) &&
              (bVar1 = DObject::IsKindOf((DObject *)check,AWeapon::RegistrationInfo.MyClass), bVar1)
              ) && (bVar1 = AWeapon::CheckAmmo((AWeapon *)check,2,false,false,-1), bVar1)) {
            ((this->super_AActor).player)->PendingWeapon = (AWeapon *)check;
            ((this->super_AActor).player)->ReadyWeapon = (AWeapon *)check;
          }
        }
        else {
          pcVar3 = FName::GetChars(&(local_40->super_PClass).super_PNativeStruct.super_PStruct.
                                    super_PNamedType.TypeName);
          Printf("\x1cI%s is not an inventory item and cannot be given to a player as start item.\n"
                 ,pcVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void APlayerPawn::GiveDefaultInventory ()
{
	if (player == NULL) return;

	// HexenArmor must always be the first item in the inventory because
	// it provides player class based protection that should not affect
	// any other protection item.
	PClassPlayerPawn *myclass = GetClass();
	GiveInventoryType(RUNTIME_CLASS(AHexenArmor));
	AHexenArmor *harmor = FindInventory<AHexenArmor>();
	harmor->Slots[4] = myclass->HexenArmor[0];
	for (int i = 0; i < 4; ++i)
	{
		harmor->SlotsIncrement[i] = myclass->HexenArmor[i + 1];
	}

	// BasicArmor must come right after that. It should not affect any
	// other protection item as well but needs to process the damage
	// before the HexenArmor does.
	ABasicArmor *barmor = Spawn<ABasicArmor> ();
	barmor->BecomeItem ();
	barmor->SavePercent = 0;
	barmor->Amount = 0;
	AddInventory (barmor);

	// Now add the items from the DECORATE definition
	DDropItem *di = GetDropItems();

	while (di)
	{
		PClassActor *ti = PClass::FindActor (di->Name);
		if (ti)
		{
			if (!ti->IsDescendantOf(RUNTIME_CLASS(AInventory)))
			{
				Printf(TEXTCOLOR_ORANGE "%s is not an inventory item and cannot be given to a player as start item.\n", ti->TypeName.GetChars());
			}
			else
			{
				AInventory *item = FindInventory(ti);
				if (item != NULL)
				{
					item->Amount = clamp<int>(
						item->Amount + (di->Amount ? di->Amount : ((AInventory *)item->GetDefault())->Amount),
						0, item->MaxAmount);
				}
				else
				{
					item = static_cast<AInventory *>(Spawn(ti));
					item->ItemFlags |= IF_IGNORESKILL;	// no skill multiplicators here
					item->Amount = di->Amount;
					if (item->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						// To allow better control any weapon is emptied of
						// ammo before being given to the player.
						static_cast<AWeapon*>(item)->AmmoGive1 =
							static_cast<AWeapon*>(item)->AmmoGive2 = 0;
					}
					AActor *check;
					if (!item->CallTryPickup(this, &check))
					{
						if (check != this)
						{
							// Player was morphed. This is illegal at game start.
							// This problem is only detectable when it's too late to do something about it...
							I_Error("Cannot give morph items when starting a game");
						}
						item->Destroy();
						item = NULL;
					}
				}
				if (item != NULL && item->IsKindOf(RUNTIME_CLASS(AWeapon)) &&
					static_cast<AWeapon*>(item)->CheckAmmo(AWeapon::EitherFire, false))
				{
					player->ReadyWeapon = player->PendingWeapon = static_cast<AWeapon *> (item);
				}
			}
		}
		di = di->Next;
	}
}